

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_FArrayBox.cpp
# Opt level: O0

void __thiscall amrex::FArrayBox::writeOn(FArrayBox *this,ostream *os,int comp,int num_comp)

{
  undefined4 in_ECX;
  undefined4 in_EDX;
  undefined8 in_RSI;
  undefined8 in_RDI;
  
  (**(code **)(*fabio + 0x30))(fabio,in_RSI,in_RDI,in_ECX);
  std::ostream::flush();
  (**(code **)(*fabio + 0x18))(fabio,in_RSI,in_RDI,in_EDX,in_ECX);
  return;
}

Assistant:

void
FArrayBox::writeOn (std::ostream& os, int comp, int num_comp) const
{
//    BL_PROFILE("FArrayBox::writeOn");
    BL_ASSERT(comp >= 0 && num_comp >= 1 && (comp+num_comp) <= nComp());
    fabio->write_header(os, *this, num_comp);
    os.flush();  // 2016-08-30: Titan requires this flush() (probably due to a bug).
#ifdef AMREX_USE_GPU
    if (this->arena()->isManaged() || this->arena()->isDevice()) {
        FArrayBox hostfab(this->box(), num_comp, The_Pinned_Arena());
        Gpu::dtoh_memcpy_async(hostfab.dataPtr(), this->dataPtr(comp), hostfab.size()*sizeof(Real));
        Gpu::streamSynchronize();
        fabio->write(os, hostfab, 0, num_comp);
    } else
#endif
    {
        fabio->write(os, *this, comp, num_comp);
    }
}